

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::MID(Parser *this)

{
  Lex local_1c;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  HIGH(this);
  if ((((this->c_type == LEX_EQ) || (this->c_type == LEX_LSS)) || (this->c_type == LEX_GTR)) ||
     (((this->c_type == LEX_LEQ || (this->c_type == LEX_GEQ)) || (this->c_type == LEX_NEQ)))) {
    Lex::Lex(&local_1c,this->c_type,0,0);
    std::stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_>::push(&this->lex_stack,&local_1c);
    Lex::~Lex(&local_1c);
    get_lex(this);
    HIGH(this);
    check_op(this);
  }
  return;
}

Assistant:

void Parser::MID(){
    HIGH();
    if (c_type == LEX_EQ || c_type == LEX_LSS || c_type == LEX_GTR ||
         c_type == LEX_LEQ || c_type == LEX_GEQ || c_type == LEX_NEQ)
    {
        lex_stack.push (c_type);
        get_lex();
        HIGH();
        check_op();
    }
}